

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool absl::lts_20240722::debugging_internal::ParseCVQualifiers(State *state)

{
  ParseState *pPVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  undefined4 uVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  ComplexityGuard guard;
  uint uVar11;
  
  iVar10 = state->recursion_depth;
  iVar2 = state->steps;
  iVar9 = iVar10 + 1;
  state->recursion_depth = iVar9;
  iVar4 = iVar2 + 1;
  state->steps = iVar4;
  uVar11 = 0;
  if (iVar2 < 0x20000 && iVar10 < 0x100) {
    pPVar1 = &state->parse_state;
    while( true ) {
      state->recursion_depth = iVar9 + 1;
      state->steps = iVar4 + 1;
      if ((0xff < iVar9) || (0x1ffff < iVar4)) goto LAB_001031c6;
      iVar9 = pPVar1->mangled_idx;
      iVar4 = pPVar1->out_cur_idx;
      iVar10 = (state->parse_state).prev_name_idx;
      uVar5 = *(undefined4 *)&(state->parse_state).field_0xc;
      bVar6 = ParseOneCharToken(state,'U');
      if (!bVar6) break;
      uVar3 = *(uint *)&(state->parse_state).field_0xc;
      *(uint *)&(state->parse_state).field_0xc = uVar3 & 0x7fffffff;
      bVar6 = ParseSourceName(state);
      if (!bVar6) {
        pPVar1->mangled_idx = iVar9;
        pPVar1->out_cur_idx = iVar4;
        (state->parse_state).prev_name_idx = iVar10;
        *(undefined4 *)&(state->parse_state).field_0xc = uVar5;
        break;
      }
      ParseTemplateArgs(state);
      *(uint *)&(state->parse_state).field_0xc =
           *(uint *)&(state->parse_state).field_0xc & 0x7fffffff | uVar3 & 0x80000000;
      iVar4 = state->steps;
      iVar9 = state->recursion_depth + -1;
      state->recursion_depth = iVar9;
      uVar11 = uVar11 + 1;
    }
    iVar9 = state->recursion_depth + -1;
LAB_001031c6:
    state->recursion_depth = iVar9;
    bVar6 = ParseOneCharToken(state,'r');
    bVar7 = ParseOneCharToken(state,'V');
    bVar8 = ParseOneCharToken(state,'K');
    uVar11 = (uint)(bVar8 || (uint)bVar7 + (uint)bVar6 + uVar11 != 0);
    iVar10 = state->recursion_depth + -1;
  }
  state->recursion_depth = iVar10;
  return SUB41(uVar11,0);
}

Assistant:

static bool ParseCVQualifiers(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  int num_cv_qualifiers = 0;
  while (ParseExtendedQualifier(state)) ++num_cv_qualifiers;
  num_cv_qualifiers += ParseOneCharToken(state, 'r');
  num_cv_qualifiers += ParseOneCharToken(state, 'V');
  num_cv_qualifiers += ParseOneCharToken(state, 'K');
  return num_cv_qualifiers > 0;
}